

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O1

Conjuncts *
CheckInTables(DdNode *node,DdNode *g1,DdNode *h1,DdNode *g2,DdNode *h2,st__table *ghTable,
             st__table *cacheTable,int *outOfMem)

{
  int iVar1;
  int iVar2;
  Conjuncts *value;
  DdNode *pDVar3;
  char *value_00;
  char *key;
  DdNode *pDVar4;
  
  *outOfMem = 0;
  iVar1 = PairInTables(g1,h1,ghTable);
  iVar2 = PairInTables(g2,h2,ghTable);
  if (iVar1 == 0 && iVar2 == 0) {
    return (Conjuncts *)0x0;
  }
  value = (Conjuncts *)malloc(0x10);
  if (value == (Conjuncts *)0x0) {
    *outOfMem = 1;
    return (Conjuncts *)0x0;
  }
  pDVar3 = g1;
  pDVar4 = h1;
  if ((((iVar1 == 1) || (pDVar3 = g2, pDVar4 = h2, iVar2 == 1)) ||
      (pDVar3 = h1, pDVar4 = g1, iVar1 == 2)) || (pDVar3 = h2, pDVar4 = g2, iVar2 == 2)) {
    value->g = pDVar3;
    value->h = pDVar4;
  }
  else {
    switch(iVar1) {
    case 3:
      value->g = g1;
      value->h = h1;
      if (one != h1) {
        value_00 = (char *)0x2;
LAB_007c9e1b:
        key = (char *)((ulong)h1 & 0xfffffffffffffffe);
LAB_007c9e6f:
        iVar1 = st__insert(ghTable,key,value_00);
        if (iVar1 == -10000) {
          *outOfMem = 1;
          goto LAB_007c9da5;
        }
      }
      break;
    default:
      switch(iVar2) {
      case 3:
        value->g = g2;
        value->h = h2;
        if (one != h2) {
          value_00 = (char *)0x2;
LAB_007c9ef3:
          key = (char *)((ulong)h2 & 0xfffffffffffffffe);
          goto LAB_007c9e6f;
        }
        break;
      default:
        if (iVar1 == 6) {
          value->g = h1;
          value->h = g1;
          if (one != g1) {
            value_00 = (char *)0x2;
            goto LAB_007c9e67;
          }
        }
        else if (iVar1 == 4) {
          value->g = h1;
          value->h = g1;
          if (one != h1) {
            value_00 = (char *)0x1;
            goto LAB_007c9e1b;
          }
        }
        else if (iVar2 == 6) {
          value->g = h2;
          value->h = g2;
          if (one != g2) {
            value_00 = (char *)0x2;
            goto LAB_007c9f42;
          }
        }
        else if (iVar2 == 4) {
          value->g = h2;
          value->h = g2;
          if (one != h2) {
            value_00 = (char *)0x1;
            goto LAB_007c9ef3;
          }
        }
        break;
      case 5:
        value->g = g2;
        value->h = h2;
        if (one != g2) {
          value_00 = (char *)0x1;
LAB_007c9f42:
          key = (char *)((ulong)g2 & 0xfffffffffffffffe);
          goto LAB_007c9e6f;
        }
        break;
      case 7:
        value->g = g2;
        value->h = h2;
        if (one != h2) {
          value_00 = (char *)0x3;
          goto LAB_007c9ef3;
        }
        break;
      case 8:
        value->g = g2;
        value->h = h2;
        if (one != g2) {
          value_00 = (char *)0x3;
          goto LAB_007c9f42;
        }
      }
      break;
    case 5:
      value->g = g1;
      value->h = h1;
      if (one != g1) {
        value_00 = (char *)0x1;
LAB_007c9e67:
        key = (char *)((ulong)g1 & 0xfffffffffffffffe);
        goto LAB_007c9e6f;
      }
      break;
    case 7:
      value->g = g1;
      value->h = h1;
      if (one != h1) {
        value_00 = (char *)0x3;
        goto LAB_007c9e1b;
      }
      break;
    case 8:
      value->g = g1;
      value->h = h1;
      if (one != g1) {
        value_00 = (char *)0x3;
        goto LAB_007c9e67;
      }
    }
  }
  iVar1 = st__insert(cacheTable,(char *)node,(char *)value);
  if (iVar1 != -10000) {
    return value;
  }
  *outOfMem = 1;
LAB_007c9da5:
  free(value);
  return (Conjuncts *)0x0;
}

Assistant:

static Conjuncts *
CheckInTables(
  DdNode * node,
  DdNode * g1,
  DdNode * h1,
  DdNode * g2,
  DdNode * h2,
  st__table * ghTable,
  st__table * cacheTable,
  int * outOfMem)
{
    int pairValue1,  pairValue2;
    Conjuncts *factors;
    int value;
    
    *outOfMem = 0;

    /* check existence of pair in table */
    pairValue1 = PairInTables(g1, h1, ghTable);
    pairValue2 = PairInTables(g2, h2, ghTable);

    /* if none of the 4 exist in the gh tables, return NULL */
    if ((pairValue1 == NONE) && (pairValue2 == NONE)) {
        return NULL;
    }
    
    factors = ABC_ALLOC(Conjuncts, 1);
    if (factors == NULL) {
        *outOfMem = 1;
        return NULL;
    }

    /* pairs that already exist in the table get preference. */
    if (pairValue1 == PAIR_ST) {
        factors->g = g1;
        factors->h = h1;
    } else if (pairValue2 == PAIR_ST) {
        factors->g = g2;
        factors->h = h2;
    } else if (pairValue1 == PAIR_CR) {
        factors->g = h1;
        factors->h = g1;
    } else if (pairValue2 == PAIR_CR) {
        factors->g = h2;
        factors->h = g2;
    } else if (pairValue1 == G_ST) {
        /* g exists in the table, h is not found in either table */
        factors->g = g1;
        factors->h = h1;
        if (h1 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == BOTH_G) {
        /* g and h are  found in the g table */
        factors->g = g1;
        factors->h = h1;
        if (h1 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == H_ST) {
        /* h exists in the table, g is not found in either table */
        factors->g = g1;
        factors->h = h1;
        if (g1 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == BOTH_H) {
        /* g and h are  found in the h table */
        factors->g = g1;
        factors->h = h1;
        if (g1 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == G_ST) {
        /* g exists in the table, h is not found in either table */
        factors->g = g2;
        factors->h = h2;
        if (h2 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if  (pairValue2 == BOTH_G) {
        /* g and h are  found in the g table */
        factors->g = g2;
        factors->h = h2;
        if (h2 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == H_ST) { 
        /* h exists in the table, g is not found in either table */
        factors->g = g2;
        factors->h = h2;
        if (g2 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == BOTH_H) {
        /* g and h are  found in the h table */
        factors->g = g2;
        factors->h = h2;
        if (g2 != one) {
            value = 3;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == G_CR) {
        /* g found in h table and h in none */
        factors->g = h1;
        factors->h = g1;
        if (h1 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue1 == H_CR) {
        /* h found in g table and g in none */
        factors->g = h1;
        factors->h = g1;
        if (g1 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g1),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == G_CR) {
        /* g found in h table and h in none */
        factors->g = h2;
        factors->h = g2;
        if (h2 != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    } else if (pairValue2 == H_CR) {
        /* h found in g table and g in none */
        factors->g = h2;
        factors->h = g2;
        if (g2 != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g2),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                *outOfMem = 1;
                ABC_FREE(factors);
                return(NULL);
            }
        }
    }
    
    /* Store factors in cache table for later use. */
    if ( st__insert(cacheTable, (char *)node, (char *)factors) ==
            st__OUT_OF_MEM) {
        *outOfMem = 1;
        ABC_FREE(factors);
        return(NULL);
    }
    return factors;
}